

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_verify(secp256k1_gej *a)

{
  secp256k1_gej *a_local;
  
  return;
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
#ifdef VERIFY
    secp256k1_fe_verify(&a->x);
    secp256k1_fe_verify(&a->y);
    secp256k1_fe_verify(&a->z);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
#endif
    (void)a;
}